

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O3

string * ts2string_abi_cxx11_(time_t t)

{
  string *in_RDI;
  char szBuf [50];
  tm tm;
  time_t local_90;
  char local_88 [56];
  tm local_50;
  
  gmtime_r(&local_90,&local_50);
  strftime(local_88,0x31,"%Y-%m-%d %H:%M:%S",&local_50);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_88);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string ts2string (time_t t)
{
    // format it nicely
    char szBuf[50];
    struct tm tm;
    gmtime_s(&tm, &t);
    strftime(szBuf,
             sizeof(szBuf) - 1,
             "%Y-%m-%d %H:%M:%S",       // %F %T
             &tm);
    return std::string(szBuf);
}